

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv__udp_connect(uv_udp_t *handle,sockaddr *addr,uint addrlen)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int err;
  uint addrlen_local;
  sockaddr *addr_local;
  uv_udp_t *handle_local;
  
  handle_local._4_4_ = uv__udp_maybe_deferred_bind(handle,(uint)addr->sa_family,0);
  if (handle_local._4_4_ == 0) {
    do {
      piVar2 = __errno_location();
      *piVar2 = 0;
      iVar1 = connect((handle->io_watcher).fd,(sockaddr *)addr,addrlen);
      bVar3 = false;
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (iVar1 == 0) {
      handle->flags = handle->flags | 0x2000000;
      handle_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      handle_local._4_4_ = -*piVar2;
    }
  }
  return handle_local._4_4_;
}

Assistant:

int uv__udp_connect(uv_udp_t* handle,
                    const struct sockaddr* addr,
                    unsigned int addrlen) {
  int err;

  err = uv__udp_maybe_deferred_bind(handle, addr->sa_family, 0);
  if (err)
    return err;

  do {
    errno = 0;
    err = connect(handle->io_watcher.fd, addr, addrlen);
  } while (err == -1 && errno == EINTR);

  if (err)
    return UV__ERR(errno);

  handle->flags |= UV_HANDLE_UDP_CONNECTED;

  return 0;
}